

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

DropIndicatorPosition __thiscall
QListModeViewBase::position(QListModeViewBase *this,QPoint *pos,QRect *rect,QModelIndex *index)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined8 in_RCX;
  QPoint *in_RDX;
  bool in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  int margin;
  DropIndicatorPosition r;
  QRect touchingRect;
  ItemFlag in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  DropIndicatorPosition DVar6;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar6 = OnViewport;
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x3e4) & 1) == 0) {
    in_stack_ffffffffffffffb0 = 2;
    iVar3 = QPoint::x((QPoint *)0x87ff4f);
    iVar4 = QRect::left((QRect *)0x87ff5d);
    if (iVar3 - iVar4 < 2) {
      DVar6 = AboveItem;
    }
    else {
      iVar3 = QRect::right((QRect *)0x87ff7e);
      iVar4 = QPoint::x((QPoint *)0x87ff8c);
      if (iVar3 - iVar4 < 2) {
        DVar6 = BelowItem;
      }
      else {
        uVar5 = QRect::contains(in_RDX,in_SIL);
        if ((uVar5 & 1) != 0) {
          DVar6 = OnItem;
        }
      }
    }
  }
  else {
    local_18 = *(undefined8 *)in_RDX;
    local_10 = *(undefined8 *)(in_RDX + 8);
    QRect::adjust((QRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                  in_stack_ffffffffffffff90);
    uVar5 = QRect::contains((QPoint *)&local_18,in_SIL);
    if ((uVar5 & 1) != 0) {
      DVar6 = OnItem;
    }
  }
  bVar2 = false;
  if (DVar6 == OnItem) {
    plVar1 = *(long **)(*(long *)(in_RDI + 8) + 0x2f8);
    (**(code **)(*plVar1 + 0x138))(plVar1,in_RCX);
    local_1c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    bVar2 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_1c);
  }
  if (bVar2 != false) {
    iVar3 = QPoint::x((QPoint *)0x880098);
    QRect::center((QRect *)CONCAT44(DVar6,in_stack_ffffffffffffffb0));
    iVar4 = QPoint::x((QPoint *)0x8800b5);
    DVar6 = BelowItem;
    if (iVar3 < iVar4) {
      DVar6 = AboveItem;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return DVar6;
}

Assistant:

QAbstractItemView::DropIndicatorPosition QListModeViewBase::position(const QPoint &pos, const QRect &rect, const QModelIndex &index) const
{
    QAbstractItemView::DropIndicatorPosition r = QAbstractItemView::OnViewport;
    if (!dd->overwrite) {
        const int margin = 2;
        if (pos.x() - rect.left() < margin) {
            r = QAbstractItemView::AboveItem;   // Visually, on the left
        } else if (rect.right() - pos.x() < margin) {
            r = QAbstractItemView::BelowItem;   // Visually, on the right
        } else if (rect.contains(pos, true)) {
            r = QAbstractItemView::OnItem;
        }
    } else {
        QRect touchingRect = rect;
        touchingRect.adjust(-1, -1, 1, 1);
        if (touchingRect.contains(pos, false)) {
            r = QAbstractItemView::OnItem;
        }
    }

    if (r == QAbstractItemView::OnItem && (!(dd->model->flags(index) & Qt::ItemIsDropEnabled)))
        r = pos.x() < rect.center().x() ? QAbstractItemView::AboveItem : QAbstractItemView::BelowItem;

    return r;
}